

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.c
# Opt level: O3

LY_ERR ly_set_rm(ly_set *set,void *object,_func_void_void_ptr *destructor)

{
  uint uVar1;
  LY_ERR LVar2;
  ulong uVar3;
  char *pcVar4;
  
  if (set == (ly_set *)0x0) {
    pcVar4 = "set";
  }
  else {
    if (object != (void *)0x0) {
      uVar1 = set->count;
      if ((ulong)uVar1 == 0) {
        uVar3 = 0;
LAB_00112d2b:
        if ((uint32_t)uVar3 != uVar1) {
          LVar2 = ly_set_rm_index(set,(uint32_t)uVar3,destructor);
          return LVar2;
        }
      }
      else {
        uVar3 = 0;
        do {
          if ((set->field_2).dnodes[uVar3] == (lyd_node *)object) goto LAB_00112d2b;
          uVar3 = uVar3 + 1;
        } while (uVar1 != uVar3);
      }
    }
    pcVar4 = "object";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar4,"ly_set_rm");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_set_rm(struct ly_set *set, void *object, void (*destructor)(void *obj))
{
    uint32_t i;

    LY_CHECK_ARG_RET(NULL, set, object, LY_EINVAL);

    /* get index */
    for (i = 0; i < set->count; i++) {
        if (set->objs[i] == object) {
            break;
        }
    }
    LY_CHECK_ERR_RET((i == set->count), LOGARG(NULL, object), LY_EINVAL); /* object is not in set */

    return ly_set_rm_index(set, i, destructor);
}